

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

bool __thiscall slang::SourceManager::isMacroArgLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  bVar1 = isMacroArgLocImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return bVar1;
}

Assistant:

bool SourceManager::isMacroArgLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return isMacroArgLocImpl(location, lock);
}